

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MD3Loader.cpp
# Opt level: O2

void RemoveSingleNodeFromList(aiNode *nd)

{
  aiNode *paVar1;
  ulong uVar2;
  uint uVar3;
  
  if (((nd != (aiNode *)0x0) && (nd->mNumChildren == 0)) &&
     (paVar1 = nd->mParent, paVar1 != (aiNode *)0x0)) {
    for (uVar2 = 0; paVar1->mNumChildren != uVar2; uVar2 = uVar2 + 1) {
      if (paVar1->mChildren[uVar2] == nd) {
        uVar3 = paVar1->mNumChildren - 1;
        paVar1->mNumChildren = uVar3;
        for (; uVar2 < uVar3; uVar2 = uVar2 + 1) {
          paVar1->mChildren[uVar2] = paVar1->mChildren[uVar2 + 1];
          uVar3 = paVar1->mNumChildren;
        }
        aiNode::~aiNode(nd);
        operator_delete(nd);
        return;
      }
    }
  }
  return;
}

Assistant:

void RemoveSingleNodeFromList(aiNode* nd)
{
    if (!nd || nd->mNumChildren || !nd->mParent)return;
    aiNode* par = nd->mParent;
    for (unsigned int i = 0; i < par->mNumChildren;++i) {
        if (par->mChildren[i] == nd) {
            --par->mNumChildren;
            for (;i < par->mNumChildren;++i) {
                par->mChildren[i] = par->mChildren[i+1];
            }
            delete nd;
            break;
        }
    }
}